

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void * threadHandler(void *indx)

{
  uint thread_index;
  int conn_sockfd;
  
  thread_index = *indx;
  printf("THREAD #%d ready.\n",(ulong)thread_index);
  do {
    sem_wait((sem_t *)(evsem + (int)thread_index));
    pthread_mutex_lock((pthread_mutex_t *)&lock_g);
    conn_sockfd = fds[(int)thread_index];
    pthread_mutex_unlock((pthread_mutex_t *)&lock_g);
    dispatcher(conn_sockfd,thread_index);
    printf("Thread #%d closed session, client disconnected.\n",(ulong)thread_index);
    pthread_mutex_lock((pthread_mutex_t *)&lock_g);
    busy[(int)thread_index] = 0;
    printf("MAIN: Thread #%d has been freed.\n",(ulong)thread_index);
    pthread_mutex_unlock((pthread_mutex_t *)&lock_g);
    sem_post((sem_t *)&free_threads);
  } while( true );
}

Assistant:

void* 
threadHandler(void* indx)
{
    int thread_index = *(int*) indx;       // unpacking argument
    int conn_sockfd;                       // file desc. local variable

    
    printf("THREAD #%d ready.\n", thread_index);



    while(1)
    {
        
        // waiting for a request assigned by the main thread
        xp_sem_wait(&evsem[thread_index]);
        
        
            /* critical section */
            pthread_mutex_lock(&lock_g);
                conn_sockfd = fds[thread_index];
            pthread_mutex_unlock(&lock_g);
            /* end critical section */


            // serving the request (dispatched)
            dispatcher(conn_sockfd, thread_index);
            
            // you here when the client has disconnected, assiciated to `thread_index` has left.
            printf ("Thread #%d closed session, client disconnected.\n", thread_index);
        


        
            // notifying the main thread that THIS thread is now free and can be assigned to new requests.
        
            /* critical section */
            pthread_mutex_lock(&lock_g);
                busy[thread_index] = 0;
                printf("MAIN: Thread #%d has been freed.\n", thread_index);
            pthread_mutex_unlock(&lock_g);
            /* end critical section */
    
    
        xp_sem_post(&free_threads);

    }

    pthread_exit(NULL);
    
}